

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O2

void __thiscall wasm::ThreadPool::notifyThreadIsReady(ThreadPool *this)

{
  std::mutex::lock((mutex *)threadMutex);
  LOCK();
  (this->ready).super___atomic_base<unsigned_long>._M_i =
       (this->ready).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)threadMutex);
  return;
}

Assistant:

void ThreadPool::notifyThreadIsReady() {
  DEBUG_POOL("notify thread is ready\n";)
  std::lock_guard<std::mutex> lock(threadMutex);
  ready.fetch_add(1);
  condition.notify_one();
}